

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O1

int __thiscall QFilePrivate::copy(QFilePrivate *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QObject *this_00;
  QArrayData *data;
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Permissions permissions;
  FileError err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *__buf;
  void *pvVar6;
  undefined4 extraout_var_01;
  size_t __nbytes;
  int __oflag;
  undefined8 unaff_RBP;
  long in_FS_OFFSET;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  char block [4096];
  QString local_1098;
  QString local_1080;
  QSaveFile local_1068;
  QString local_1058;
  QString local_1038 [170];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
            super_QObjectData.q_ptr;
  iVar3 = (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
            super_QObjectData._vptr_QObjectData[7])();
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar3),dst);
  iVar3 = (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (cVar1 != '\0') goto LAB_002373ba;
  iVar3 = (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xd])(this_00,0x21);
  if ((char)iVar3 == '\0') {
    QMetaObject::tr(&local_1058,&QFile::staticMetaObject,"Cannot open %1 for input",(char *)0x0,-1);
    a_00.m_size = (this->fileName).d.size | 0x8000000000000000;
    a_00.field_0.m_data_utf16 = (this->fileName).d.ptr;
    QString::arg_impl(local_1038,&local_1058,a_00,0,(QChar)0x20);
    QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,local_1038);
    if (&(local_1038[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_1038[0].d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1058.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1058.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar3 = 0;
    goto LAB_002373ba;
  }
  local_1068.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_1068.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QSaveFile::QSaveFile(&local_1068,(QString *)dst);
  QSaveFile::setDirectWriteFallback(&local_1068,true);
  iVar3 = QSaveFile::open(&local_1068,(char *)0x22,__oflag);
  if ((char)iVar3 == '\0') {
    (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
    QMetaObject::tr(&local_1058,&QFile::staticMetaObject,"Cannot open for output: %1",(char *)0x0,-1
                   );
    QIODevice::errorString(&local_1080,(QIODevice *)&local_1068);
    a_01.m_size = local_1080.d.size | 0x8000000000000000;
    a_01.field_0.m_data_utf16 = local_1080.d.ptr;
    QString::arg_impl(local_1038,&local_1058,a_01,0,(QChar)0x20);
    QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,local_1038);
LAB_00237345:
    if (&(local_1038[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_1038[0].d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1080.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1080.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_1058.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      local_1038[0].d.d = local_1058.d.d;
      if (((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_0023739f:
        QArrayData::deallocate(&(local_1038[0].d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_002373ae:
    iVar3 = 0;
  }
  else {
    iVar3 = (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
              super_QObjectData._vptr_QObjectData[7])(this);
    iVar4 = (*(local_1068.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d)->
              _vptr_QObjectData[7])();
    __nbytes = *(size_t *)CONCAT44(extraout_var_00,iVar3);
    uVar5 = (**(code **)(__nbytes + 0x100))((size_t *)CONCAT44(extraout_var_00,iVar3),iVar4);
    if ((char)uVar5 == '\0') {
      (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
      QMetaObject::tr(&local_1058,&QFile::staticMetaObject,"Could not copy to %1: %2",(char *)0x0,-1
                     );
      iVar3 = (*(this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
                super_QObjectData._vptr_QObjectData[7])(this);
      QAbstractFileEngine::errorString
                (&local_1080,(QAbstractFileEngine *)CONCAT44(extraout_var_01,iVar3));
      QString::arg<QString_const&,QString>(local_1038,&local_1058,(QString *)dst,&local_1080);
      QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,local_1038);
      goto LAB_00237345;
    }
    if ((uVar5 & 0xff) == 0xff) {
      do {
        memset(local_1038,0xaa,0x1000);
        iVar3 = (int)local_1038;
        __buf = (void *)QIODevice::read((QIODevice *)this_00,iVar3,(void *)0x1000,__nbytes);
        if (__buf == (void *)0x0) {
          __nbytes = 3;
        }
        else {
          if ((long)__buf < 0) {
            local_1058.d.d = (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.d
            ;
            local_1058.d.ptr =
                 (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.ptr;
            (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.d = (Data *)0x0;
            (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.ptr =
                 (char16_t *)0x0;
            local_1058.d.size =
                 (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.size;
            (this->super_QFileDevicePrivate).super_QIODevicePrivate.errorString.d.size = 0;
            (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
            QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,&local_1058);
            if (&(local_1058.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   + -1;
              iVar3 = ((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i;
              UNLOCK();
              data = &(local_1058.d.d)->super_QArrayData;
joined_r0x00237183:
              if (iVar3 == 0) {
                QArrayData::deallocate(data,2,0x10);
              }
            }
          }
          else {
            pvVar6 = (void *)QIODevice::write((QIODevice *)&local_1068,iVar3,__buf,__nbytes);
            __nbytes = 0;
            if (__buf == pvVar6) goto LAB_0023719e;
            (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
            QMetaObject::tr(&local_1080,&QFile::staticMetaObject,"Failure to write block: %1",
                            (char *)0x0,-1);
            QIODevice::errorString(&local_1098,(QIODevice *)&local_1068);
            a.m_size = local_1098.d.size | 0x8000000000000000;
            a.field_0.m_data_utf16 = local_1098.d.ptr;
            QString::arg_impl(&local_1058,&local_1080,a,0,(QChar)0x20);
            QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,CopyError,&local_1058);
            if (&(local_1058.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   + -1;
              UNLOCK();
              if (((local_1058.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate(&(local_1058.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_1098.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1098.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1098.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   + -1;
              UNLOCK();
              if (((local_1098.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate(&(local_1098.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (&(local_1080.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   + -1;
              iVar3 = ((local_1080.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i;
              UNLOCK();
              data = &(local_1080.d.d)->super_QArrayData;
              goto joined_r0x00237183;
            }
          }
          __nbytes = 1;
        }
LAB_0023719e:
        if ((int)__nbytes != 0) {
          if ((int)__nbytes != 3) goto LAB_002373ae;
          break;
        }
      } while ((char)uVar5 == -1);
    }
    permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
    super_QFlagsStorage<QFileDevice::Permission>.i =
         (QFlagsStorageHelper<QFileDevice::Permission,_4>)
         (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0x1f])(this_00);
    QFileDevice::setPermissions(&local_1068.super_QFileDevice,permissions);
    (*((QObject *)&this_00->_vptr_QObject)->_vptr_QObject[0xe])(this_00);
    bVar2 = QSaveFile::commit(&local_1068);
    iVar3 = (int)CONCAT71((uint7)(uint3)(uVar5 >> 8),1);
    if (!bVar2) {
      err = QFileDevice::error(&local_1068.super_QFileDevice);
      QIODevice::errorString(local_1038,(QIODevice *)&local_1068);
      QFileDevicePrivate::setError(&this->super_QFileDevicePrivate,err,local_1038);
      if (&(local_1038[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_1038[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0
           ) goto LAB_002373ae;
        goto LAB_0023739f;
      }
      goto LAB_002373ae;
    }
  }
  QSaveFile::~QSaveFile(&local_1068);
LAB_002373ba:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFilePrivate::copy(const QString &newName)
{
    Q_Q(QFile);
    Q_ASSERT(error == QFile::NoError);
    Q_ASSERT(!q->isOpen());

    // Some file engines can perform this copy more efficiently (e.g., Windows
    // calling CopyFile).
    if (engine()->copy(newName))
        return true;

    if (!q->open(QFile::ReadOnly | QFile::Unbuffered)) {
        setError(QFile::CopyError, QFile::tr("Cannot open %1 for input").arg(fileName));
        return false;
    }

    QSaveFile out(newName);
    out.setDirectWriteFallback(true);
    if (!out.open(QIODevice::WriteOnly | QIODevice::Unbuffered)) {
        q->close();
        setError(QFile::CopyError, QFile::tr("Cannot open for output: %1").arg(out.errorString()));
        return false;
    }

    // Attempt to do an OS-level data copy
    QAbstractFileEngine::TriStateResult r = engine()->cloneTo(out.d_func()->engine());
    if (r == QAbstractFileEngine::TriStateResult::Failed) {
        q->close();
        setError(QFile::CopyError, QFile::tr("Could not copy to %1: %2")
                 .arg(newName, engine()->errorString()));
        return false;
    }

    while (r == QAbstractFileEngine::TriStateResult::NotSupported) {
        // OS couldn't do it, so do a block-level copy
        char block[4096];
        qint64 in = q->read(block, sizeof(block));
        if (in == 0)
            break;      // eof
        if (in < 0) {
            // Unable to read from the source. Save the error from read() above.
            QString s = std::move(errorString);
            q->close();
            setError(QFile::CopyError, std::move(s));
            return false;
        }
        if (in != out.write(block, in)) {
            q->close();
            setError(QFile::CopyError, QFile::tr("Failure to write block: %1")
                     .arg(out.errorString()));
            return false;
        }
    }

    // copy the permissions
    out.setPermissions(q->permissions());
    q->close();

    // final step: commit the copy
    if (out.commit())
        return true;
    setError(out.error(), out.errorString());
    return false;
}